

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.hpp
# Opt level: O1

void __thiscall
randomx::JitCompilerX86::genAddressReg(JitCompilerX86 *this,Instruction *instr,bool rax)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'A';
  (puVar1 + iVar2)[1] = 0x8d;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = !rax * '\b' + instr->src + 0x80;
  lVar3 = (long)this->codePos + 1;
  this->codePos = (int32_t)lVar3;
  if (instr->src == '\x04') {
    this->code[lVar3] = '$';
    this->codePos = this->codePos + 1;
  }
  *(uint32_t *)(this->code + this->codePos) = instr->imm32;
  iVar2 = this->codePos + 4;
  this->codePos = iVar2;
  if (rax) {
    this->code[iVar2] = '%';
    iVar2 = 1;
  }
  else {
    puVar1 = this->code + iVar2;
    puVar1[0] = 0x81;
    puVar1[1] = 0xe1;
    iVar2 = 2;
  }
  iVar2 = iVar2 + this->codePos;
  this->codePos = iVar2;
  uVar4 = 0x3ff8;
  if ((instr->mod & 3) == 0) {
    uVar4 = 0x3fff8;
  }
  *(undefined4 *)(this->code + iVar2) = uVar4;
  this->codePos = this->codePos + 4;
  return;
}

Assistant:

void emit(const uint8_t* src, size_t count) {
			memcpy(code + codePos, src, count);
			codePos += count;
		}